

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_bcast.c
# Opt level: O2

clnt_stat rpc_broadcast_exp(rpcprog_t prog,rpcvers_t vers,rpcproc_t proc,xdrproc_t xargs,void *argsp
                           ,xdrproc_t xresults,void *resultsp,resultproc_t eachresult,int inittime,
                           int waittime,char *nettype)

{
  int iVar1;
  int iVar2;
  broadif *pbVar3;
  _Bool _Var4;
  int iVar5;
  u_int uVar6;
  uint uVar7;
  bool_t bVar8;
  u_int uVar9;
  AUTH *pAVar10;
  void *vhandle;
  netconfig *nconf;
  int *piVar11;
  int *addr;
  broadif *__n;
  broadif *pbVar12;
  ulong uVar13;
  int *piVar14;
  code *pcVar15;
  netbuf *pnVar16;
  uint size;
  clnt_stat cVar17;
  int iVar18;
  broadif *extraout_RDX;
  broadif *extraout_RDX_00;
  broadif *extraout_RDX_01;
  broadif *extraout_RDX_02;
  broadif *bip;
  r_rpcb_rmtcallres *prVar19;
  anon_struct_16_2_4dd83919_for_link *paVar20;
  char *pcVar21;
  ulong uVar22;
  anon_struct_176_8_b9f7f77a *paVar23;
  ulong uVar24;
  broadlist_t *pbVar25;
  ulong __nfds;
  bool bVar26;
  uint local_1ae0;
  clnt_stat local_1adc;
  int *local_1ac0;
  netbuf taddr;
  rmtcallargs barg_pmap;
  rmtcallres bres_pmap;
  r_rpcb_rmtcallargs barg;
  XDR xdrs [1];
  r_rpcb_rmtcallres bres;
  pollfd pfd [20];
  timespec ts;
  rpc_msg msg;
  anon_struct_176_8_b9f7f77a fdlist [20];
  char uaddress [1024];
  
  pAVar10 = authunix_ncreate_default();
  cVar17 = (pAVar10->ah_error).re_status;
  if (cVar17 != RPC_SUCCESS) {
    LOCK();
    piVar11 = &pAVar10->ah_refcnt;
    iVar5 = *piVar11;
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (iVar5 - 1U == 0) {
      (*pAVar10->ah_ops->ah_destroy)(pAVar10);
    }
    if (((byte)__ntirpc_pkg_params.debug_flags & 0x80) == 0) {
      return cVar17;
    }
    (*__ntirpc_pkg_params.warnx_)
              ("%s: auth_put(), refs %d\n","rpc_broadcast_exp",(ulong)(iVar5 - 1U));
    return cVar17;
  }
  pcVar21 = "datagram_n";
  if (nettype != (char *)0x0) {
    pcVar21 = nettype;
  }
  vhandle = __rpc_setconf(pcVar21);
  if (vhandle == (void *)0x0) {
    cVar17 = RPC_UNKNOWNPROTO;
    goto LAB_00109ae2;
  }
  bVar26 = false;
  cVar17 = RPC_CANTENCODEARGS;
  local_1ae0 = 0;
  size = 0;
  local_1adc = RPC_SUCCESS;
  __nfds = 0;
  while( true ) {
    nconf = __rpc_getconf(vhandle);
    if (nconf == (netconfig *)0x0) break;
    if (nconf->nc_semantics == 1) {
      if (0x13 < __nfds) goto LAB_001091dd;
      iVar5 = __rpc_nconf2sockinfo(nconf,(__rpc_sockinfo *)&msg);
      if (iVar5 != 0) {
        pbVar25 = &fdlist[__nfds].nal;
        pbVar25->tqh_first = (broadif *)0x0;
        fdlist[__nfds].nal.tqh_last = &pbVar25->tqh_first;
        iVar5 = __rpc_getbroadifs(msg.rm_xid,msg.rm_direction,msg.ru.RM_cmb.cb_rpcvers,pbVar25);
        if (iVar5 != 0) {
          iVar5 = socket(msg.rm_xid,msg.ru.RM_cmb.cb_rpcvers,msg.rm_direction);
          if (iVar5 < 0) {
            local_1adc = RPC_CANTSEND;
          }
          else {
            fdlist[__nfds].af = msg.rm_xid;
            fdlist[__nfds].proto = msg.rm_direction;
            fdlist[__nfds].fd = iVar5;
            fdlist[__nfds].nconf = nconf;
            uVar6 = __rpc_get_a_size(msg.rm_xid);
            fdlist[__nfds].asize = uVar6;
            pfd[__nfds].events = 0xc3;
            fdlist[__nfds].fd = iVar5;
            pfd[__nfds].fd = iVar5;
            uVar6 = __rpc_get_t_size(msg.rm_xid,msg.rm_direction,0);
            fdlist[__nfds].dsize = uVar6;
            if (size <= uVar6) {
              size = uVar6;
            }
            if (uVar6 < local_1ae0) {
              uVar6 = local_1ae0;
            }
            if (msg.rm_direction == 0x11 && msg.rm_xid == 2) {
              local_1ae0 = uVar6;
              bVar26 = true;
            }
            __nfds = __nfds + 1;
          }
        }
      }
    }
  }
  if (__nfds == 0) {
    cVar17 = RPC_UNKNOWNPROTO;
    if (local_1adc != RPC_SUCCESS) {
      cVar17 = local_1adc;
    }
    __nfds = 0;
  }
  else {
LAB_001091dd:
    if (size == 0) {
      cVar17 = RPC_CANTSEND;
      if (local_1adc != RPC_SUCCESS) {
        cVar17 = local_1adc;
      }
    }
    else {
      uVar22 = (ulong)size;
      piVar11 = (int *)(*__ntirpc_pkg_params.malloc_)
                                 (uVar22,
                                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                                  ,0x162,"rpc_broadcast_exp");
      addr = (int *)(*__ntirpc_pkg_params.malloc_)
                              (uVar22,
                               "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                               ,0x163,"rpc_broadcast_exp");
      if (addr == (int *)0x0 || piVar11 == (int *)0x0) {
        local_1adc = RPC_SYSTEMERROR;
        local_1ac0 = (int *)0x0;
LAB_0010926c:
        cVar17 = local_1adc;
        if (piVar11 != (int *)0x0) goto LAB_00109a86;
      }
      else {
        clock_gettime(6,(timespec *)&ts);
        uVar7 = getpid();
        msg.rm_xid = uVar7 ^ (uint)ts.tv_sec ^ (uint)ts.tv_nsec;
        msg.rm_direction = CALL;
        msg.ru.RM_cmb.cb_rpcvers = 2;
        msg.cb_prog = 100000;
        msg.cb_vers = 3;
        msg.cb_proc = 5;
        bres.addr = uaddress;
        bres.results.results_val = (char *)resultsp;
        barg.prog = prog;
        barg.vers = vers;
        barg.proc = proc;
        barg.args.args_val = (char *)argsp;
        barg.xdr_args = xargs;
        bres.xdr_res = xresults;
        memcpy(&msg.cb_cred,&pAVar10->ah_cred,0x198);
        memcpy(&msg.cb_verf,&pAVar10->ah_verf,0x198);
        local_1ac0 = (int *)0x0;
        xdrmem_ncreate(xdrs,(char *)addr,size,XDR_ENCODE);
        _Var4 = xdr_ncallmsg(xdrs,&msg);
        if (_Var4) {
          _Var4 = xdr_rpcb_rmtcallargs(xdrs,(rpcb_rmtcallargs *)&barg);
          if (_Var4) {
            uVar6 = (*(xdrs[0].x_ops)->x_getpostn)(xdrs);
            if ((xdrs[0].x_ops)->x_destroy != (_func_void_rpc_xdr_ptr *)0x0) {
              (*(xdrs[0].x_ops)->x_destroy)(xdrs);
            }
            if (!bVar26) {
              local_1ac0 = (int *)0x0;
              uVar9 = 0;
LAB_001095b8:
              __n = (broadif *)(ulong)uVar6;
              for (; inittime <= waittime; inittime = inittime * 2) {
                for (uVar24 = 0; pcVar21 = (char *)pfd, uVar24 != __nfds; uVar24 = uVar24 + 1) {
                  cVar17 = RPC_CANTSEND;
                  if (uVar6 <= fdlist[uVar24].dsize) {
                    paVar23 = fdlist + uVar24;
                    paVar20 = (anon_struct_16_2_4dd83919_for_link *)&fdlist[uVar24].nal;
                    bip = __n;
                    cVar17 = local_1adc;
                    while (pbVar3 = paVar20->tqe_next, pbVar3 != (broadif *)0x0) {
                      __rpc_broadenable((int)pcVar21,paVar23->fd,bip);
                      bip = extraout_RDX;
                      if (__rpc_lowvers == 0) {
                        pcVar21 = (char *)(ulong)(uint)paVar23->fd;
                        pbVar12 = (broadif *)
                                  sendto(paVar23->fd,addr,(size_t)__n,0,
                                         (sockaddr *)&pbVar3->broadaddr,fdlist[uVar24].asize);
                        bip = extraout_RDX_00;
                        if (pbVar12 == __n) goto LAB_0010967e;
                        pcVar21 = "clnt_bcast: cannot send broadcast packet";
LAB_001096d6:
                        cVar17 = RPC_CANTSEND;
                        if ((__ntirpc_pkg_params.debug_flags._1_1_ & 0x10) != 0) {
                          (*__ntirpc_pkg_params.warnx_)(pcVar21);
                          cVar17 = RPC_CANTSEND;
                          bip = extraout_RDX_02;
                        }
                      }
                      else {
LAB_0010967e:
                        if ((bVar26) && (fdlist[uVar24].proto == 0x11)) {
                          pcVar21 = (char *)(ulong)(uint)paVar23->fd;
                          uVar13 = sendto(paVar23->fd,local_1ac0,(ulong)uVar9,0,
                                          (sockaddr *)&pbVar3->broadaddr,fdlist[uVar24].asize);
                          bip = extraout_RDX_01;
                          if (uVar13 != uVar9) {
                            pcVar21 = "clnt_bcast: Cannot send broadcast packet";
                            goto LAB_001096d6;
                          }
                        }
                      }
                      paVar20 = &pbVar3->link;
                    }
                  }
                  local_1adc = cVar17;
                }
                if (eachresult == (resultproc_t)0x0) {
                  local_1adc = RPC_SUCCESS;
                  break;
                }
LAB_0010972f:
                do {
                  iVar5 = poll((pollfd *)pfd,__nfds,inittime);
                } while (iVar5 == -1);
                if (iVar5 == 0) {
                  local_1adc = RPC_TIMEDOUT;
                }
                else {
                  uVar24 = 0;
                  iVar18 = 0;
                  while ((uVar24 < __nfds && (iVar18 < iVar5))) {
                    if (pfd[uVar24].revents != 0) {
                      if ((pfd[uVar24].revents & 0x20U) == 0) {
                        iVar18 = iVar18 + 1;
                        do {
                          uVar13 = recvfrom(fdlist[uVar24].fd,piVar11,(ulong)fdlist[uVar24].dsize,0,
                                            (sockaddr *)&fdlist[uVar24].raddr,&fdlist[uVar24].asize)
                          ;
                          if (-1 < (int)(u_int)uVar13) {
                            if ((uVar13 & 0x7ffffffc) == 0) goto LAB_0010986f;
                            iVar1 = *piVar11;
                            iVar2 = *addr;
                            if (iVar1 == iVar2) {
                              prVar19 = &bres;
                              pcVar15 = xdr_rpcb_rmtcallres;
                            }
                            else {
                              if ((!bVar26) || (iVar1 != *local_1ac0)) goto LAB_0010986f;
                              prVar19 = (r_rpcb_rmtcallres *)&bres_pmap;
                              pcVar15 = xdr_rmtcallres;
                            }
                            memcpy((void *)((long)&msg.ru.RM_rmb.ru + 0x18),&_null_auth,0x198);
                            msg.ru.RM_rmb.ru._8_8_ = pcVar15;
                            msg.ru.RM_rmb.ru._16_8_ = prVar19;
                            xdrmem_ncreate(xdrs,(char *)piVar11,(u_int)uVar13,XDR_DECODE);
                            _Var4 = xdr_nreplymsg(xdrs,&msg);
                            if (_Var4) {
                              if (msg.ru.RM_rmb.ru.RP_ar.ar_stat == SUCCESS &&
                                  msg.ru.RM_rmb.rp_stat == MSG_ACCEPTED) {
                                if ((bVar26) && (iVar1 != iVar2)) {
                                  *(ushort *)fdlist[uVar24].raddr.__ss_padding =
                                       (ushort)bres_pmap.port << 8 | (ushort)bres_pmap.port >> 8;
                                  taddr.maxlen = 0x80;
                                  taddr.len = 0x80;
                                  taddr.buf = &fdlist[uVar24].raddr;
                                  _Var4 = (*eachresult)(resultsp,&taddr,fdlist[uVar24].nconf);
                                }
                                else {
                                  pnVar16 = uaddr2taddr(fdlist[uVar24].nconf,uaddress);
                                  _Var4 = (*eachresult)(resultsp,pnVar16,fdlist[uVar24].nconf);
                                  (*__ntirpc_pkg_params.free_size_)(pnVar16,0);
                                }
                              }
                              else {
                                _Var4 = false;
                              }
                            }
                            else {
                              _Var4 = false;
                            }
                            xdrs[0].x_op = XDR_FREE;
                            msg.ru.RM_rmb.ru._8_8_ = xdr_void;
                            xdr_nreplymsg(xdrs,&msg);
                            (*xresults)(xdrs,resultsp);
                            if ((xdrs[0].x_ops)->x_destroy != (_func_void_rpc_xdr_ptr *)0x0) {
                              (*(xdrs[0].x_ops)->x_destroy)(xdrs);
                            }
                            if (_Var4 == false) goto LAB_0010972f;
                            cVar17 = RPC_SUCCESS;
                            goto LAB_00109a86;
                          }
                          piVar14 = __errno_location();
                        } while (*piVar14 == 4);
                        if ((__ntirpc_pkg_params.debug_flags._1_1_ & 0x10) != 0) {
                          (*__ntirpc_pkg_params.warnx_)
                                    ("clnt_bcast: Cannot receive reply to broadcast");
                        }
                        local_1adc = RPC_CANTRECV;
                      }
                      else {
                        pfd[uVar24].fd = -1;
                        iVar18 = iVar18 + 1;
                      }
                    }
LAB_0010986f:
                    uVar24 = uVar24 + 1;
                  }
                }
              }
              goto LAB_0010926c;
            }
            local_1ac0 = (int *)(*__ntirpc_pkg_params.malloc_)
                                          ((ulong)local_1ae0,
                                           "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/clnt_bcast.c"
                                           ,0x189,"rpc_broadcast_exp");
            if (local_1ac0 == (int *)0x0) {
              local_1ac0 = (int *)0x0;
              cVar17 = RPC_SYSTEMERROR;
            }
            else {
              msg.rm_xid = msg.rm_xid + 1;
              msg.cb_prog = 100000;
              msg.cb_vers = 2;
              msg.cb_proc = 5;
              bres_pmap.results_ptr = resultsp;
              barg_pmap.xdr_args = xargs;
              barg_pmap.args_ptr = argsp;
              barg_pmap.prog = prog;
              barg_pmap.vers = vers;
              barg_pmap.proc = proc;
              bres_pmap.xdr_results = xresults;
              xdrmem_ncreate(xdrs,(char *)local_1ac0,local_1ae0,XDR_ENCODE);
              _Var4 = xdr_ncallmsg(xdrs,&msg);
              if ((_Var4) &&
                 (bVar8 = xdr_rmtcall_args((XDR *)xdrs,(rmtcallargs *)&barg_pmap),
                 (char)bVar8 != '\0')) {
                uVar9 = (*(xdrs[0].x_ops)->x_getpostn)(xdrs);
                if ((xdrs[0].x_ops)->x_destroy != (_func_void_rpc_xdr_ptr *)0x0) {
                  (*(xdrs[0].x_ops)->x_destroy)(xdrs);
                }
                goto LAB_001095b8;
              }
            }
          }
          else {
            local_1ac0 = (int *)0x0;
          }
        }
LAB_00109a86:
        local_1adc = cVar17;
        (*__ntirpc_pkg_params.free_size_)(piVar11,uVar22);
      }
      if (addr != (int *)0x0) {
        (*__ntirpc_pkg_params.free_size_)(addr,uVar22);
      }
      cVar17 = local_1adc;
      if (local_1ac0 != (int *)0x0) {
        (*__ntirpc_pkg_params.free_size_)(local_1ac0,(ulong)local_1ae0);
      }
    }
  }
  pbVar25 = &fdlist[0].nal;
  while (bVar26 = __nfds != 0, __nfds = __nfds - 1, bVar26) {
    close(*(int *)&pbVar25[-10].tqh_first);
    __rpc_freebroadifs(pbVar25);
    pbVar25 = pbVar25 + 0xb;
  }
LAB_00109ae2:
  LOCK();
  piVar11 = &pAVar10->ah_refcnt;
  iVar5 = *piVar11;
  *piVar11 = *piVar11 + -1;
  UNLOCK();
  if (iVar5 - 1U == 0) {
    (*pAVar10->ah_ops->ah_destroy)(pAVar10);
  }
  if (((byte)__ntirpc_pkg_params.debug_flags & 0x80) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s: auth_put(), refs %d\n","rpc_broadcast_exp",(ulong)(iVar5 - 1U));
  }
  __rpc_endconf(vhandle);
  return cVar17;
}

Assistant:

enum clnt_stat
rpc_broadcast_exp(rpcprog_t prog,	/* program number */
		  rpcvers_t vers,	/* version number */
		  rpcproc_t proc,	/* procedure number */
		  xdrproc_t xargs,	/* xdr routine for args */
		  void *argsp,	/* pointer to args */
		  xdrproc_t xresults,	/* xdr routine for results */
		  void *resultsp,	/* pointer to results */
		  resultproc_t eachresult, /* call with each result obtained */
		  int inittime,	/* how long to wait initially */
		  int waittime,	/* maximum time to wait */
		  const char *nettype /* transport type */)
{
	XDR xdrs[1];
	struct rpc_msg msg;	/* RPC message */
	struct timespec ts;
	char *outbuf = NULL;	/* Broadcast msg buffer */
	char *inbuf = NULL;	/* Reply buf */
	AUTH *sys_auth = authunix_ncreate_default();
	void *handle;
	struct netconfig *nconf;
	char uaddress[1024];	/* A self imposed limit */
	char *uaddrp = uaddress;
	int pmap_reply_flag;	/* reply recvd from PORTMAP */
	/* An array of all the suitable broadcast transports */
	struct {
		int fd;		/* File descriptor */
		int af;
		int proto;
		struct netconfig *nconf;	/* Netconfig structure */
		u_int asize;	/* Size of the addr buf */
		u_int dsize;	/* Size of the data buf */
		struct sockaddr_storage raddr;	/* Remote address */
		broadlist_t nal;
	} fdlist[MAXBCAST];
	struct pollfd pfd[MAXBCAST];
	size_t fdlistno = 0;
	struct r_rpcb_rmtcallargs barg;	/* Remote arguments */
	struct r_rpcb_rmtcallres bres;	/* Remote results */
	size_t outlen;
	int msec;
	int pollretval;
	int fds_found;
	int inlen;
	int i;
#ifdef PORTMAP
	size_t outlen_pmap = 0;
	int pmap_flag = 0;	/* UDP exists ? */
	char *outbuf_pmap = NULL;
	struct rmtcallargs barg_pmap;	/* Remote arguments */
	struct rmtcallres bres_pmap;	/* Remote results */
	u_int udpbufsz = 0;
#endif				/* PORTMAP */
	u_int maxbufsize = 0;
	enum clnt_stat stat = RPC_SUCCESS;	/* Return status */

	stat = sys_auth->ah_error.re_status;
	if (stat) {
		AUTH_DESTROY(sys_auth);
		return (stat);
	}

	/*
	 * initialization: create a fd, a broadcast address, and send the
	 * request on the broadcast transport.
	 * Listen on all of them and on replies, call the user supplied
	 * function.
	 */

	if (nettype == NULL)
		nettype = "datagram_n";
	handle = __rpc_setconf(nettype);
	if (handle == NULL) {
		stat = RPC_UNKNOWNPROTO;
		goto cleanup;
	}
	while ((nconf = __rpc_getconf(handle)) != NULL) {
		int fd;
		struct __rpc_sockinfo si;

		if (nconf->nc_semantics != NC_TPI_CLTS)
			continue;
		if (fdlistno >= MAXBCAST)
			break;	/* No more slots available */
		if (!__rpc_nconf2sockinfo(nconf, &si))
			continue;

		TAILQ_INIT(&fdlist[fdlistno].nal);
		if (__rpc_getbroadifs
		    (si.si_af, si.si_proto, si.si_socktype,
		     &fdlist[fdlistno].nal) == 0)
			continue;

		fd = socket(si.si_af, si.si_socktype, si.si_proto);
		if (fd < 0) {
			stat = RPC_CANTSEND;
			continue;
		}
		fdlist[fdlistno].af = si.si_af;
		fdlist[fdlistno].proto = si.si_proto;
		fdlist[fdlistno].fd = fd;
		fdlist[fdlistno].nconf = nconf;
		fdlist[fdlistno].asize = __rpc_get_a_size(si.si_af);
		pfd[fdlistno].events =
		    POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND;
		pfd[fdlistno].fd = fdlist[fdlistno].fd = fd;
		fdlist[fdlistno].dsize =
		    __rpc_get_t_size(si.si_af, si.si_proto, 0);

		if (maxbufsize <= fdlist[fdlistno].dsize)
			maxbufsize = fdlist[fdlistno].dsize;

#ifdef PORTMAP
		if (si.si_af == AF_INET && si.si_proto == IPPROTO_UDP) {
			if (udpbufsz < fdlist[fdlistno].dsize)
				udpbufsz = fdlist[fdlistno].dsize;
			pmap_flag = 1;
		}
#endif				/* PORTMAP */
		fdlistno++;
	}

	if (fdlistno == 0) {
		if (stat == RPC_SUCCESS)
			stat = RPC_UNKNOWNPROTO;
		goto done_broad;
	}
	if (maxbufsize == 0) {
		if (stat == RPC_SUCCESS)
			stat = RPC_CANTSEND;
		goto done_broad;
	}
	inbuf = mem_alloc(maxbufsize);
	outbuf = mem_alloc(maxbufsize);
	if ((inbuf == NULL) || (outbuf == NULL)) {
		stat = RPC_SYSTEMERROR;
		goto done_broad;
	}

	/* Serialize all the arguments which have to be sent */
	(void)clock_gettime(CLOCK_MONOTONIC_FAST, &ts);
	msg.rm_xid = __RPC_GETXID(&ts);
	msg.rm_direction = CALL;
	msg.rm_call.cb_rpcvers = RPC_MSG_VERSION;
	msg.cb_prog = RPCBPROG;
	msg.cb_vers = RPCBVERS;
	msg.cb_proc = RPCBPROC_CALLIT;
	barg.prog = prog;
	barg.vers = vers;
	barg.proc = proc;
	barg.args.args_val = argsp;
	barg.xdr_args = xargs;
	bres.addr = uaddrp;
	bres.results.results_val = resultsp;
	bres.xdr_res = xresults;
	msg.cb_cred = sys_auth->ah_cred;
	msg.cb_verf = sys_auth->ah_verf;
	xdrmem_create(xdrs, outbuf, maxbufsize, XDR_ENCODE);
	if ((!xdr_callmsg(xdrs, &msg))
	    ||
	    (!xdr_rpcb_rmtcallargs
	     (xdrs, (struct rpcb_rmtcallargs *)(void *)&barg))) {
		stat = RPC_CANTENCODEARGS;
		goto done_broad;
	}
	outlen = xdr_getpos(xdrs);
	xdr_destroy(xdrs);

#ifdef PORTMAP
	/* Prepare the packet for version 2 PORTMAP */
	if (pmap_flag) {
		outbuf_pmap = mem_alloc(udpbufsz);
		if (outbuf_pmap == NULL) {
			stat = RPC_SYSTEMERROR;
			goto done_broad;
		}
		msg.rm_xid++;	/* One way to distinguish */
		msg.cb_prog = PMAPPROG;
		msg.cb_vers = PMAPVERS;
		msg.cb_proc = PMAPPROC_CALLIT;
		barg_pmap.prog = prog;
		barg_pmap.vers = vers;
		barg_pmap.proc = proc;
		barg_pmap.args_ptr = argsp;
		barg_pmap.xdr_args = xargs;
		bres_pmap.xdr_results = xresults;
		bres_pmap.results_ptr = resultsp;
		xdrmem_create(xdrs, outbuf_pmap, udpbufsz, XDR_ENCODE);
		if ((!xdr_callmsg(xdrs, &msg))
		    || (!xdr_rmtcall_args(xdrs, &barg_pmap))) {
			stat = RPC_CANTENCODEARGS;
			goto done_broad;
		}
		outlen_pmap = xdr_getpos(xdrs);
		xdr_destroy(xdrs);
	}
#endif				/* PORTMAP */

	/*
	 * Basic loop: broadcast the packets to transports which
	 * support data packets of size such that one can encode
	 * all the arguments.
	 * Wait a while for response(s).
	 * The response timeout grows larger per iteration.
	 */
	for (msec = inittime; msec <= waittime; msec += msec) {
		struct broadif *bip;

		/* Broadcast all the packets now */
		for (i = 0; i < fdlistno; i++) {
			if (fdlist[i].dsize < outlen) {
				stat = RPC_CANTSEND;
				continue;
			}
			for (bip = TAILQ_FIRST(&fdlist[i].nal); bip != NULL;
			     bip = TAILQ_NEXT(bip, link)) {
				void *addr;

				addr = &bip->broadaddr;

				__rpc_broadenable(fdlist[i].af, fdlist[i].fd,
						  bip);

				/*
				 * Only use version 3 if lowvers is not set
				 */

				if (!__rpc_lowvers)
					if (sendto
					    (fdlist[i].fd, outbuf, outlen, 0,
					     (struct sockaddr *)addr,
					     (size_t) fdlist[i].asize) !=
					    outlen) {
#ifdef RPC_DEBUG
						perror("sendto");
#endif
						__warnx
						   (TIRPC_DEBUG_FLAG_CLNT_BCAST,
						    "clnt_bcast: cannot send "
						    "broadcast packet");
						stat = RPC_CANTSEND;
						continue;
					};
#ifdef RPC_DEBUG
				if (!__rpc_lowvers)
					fprintf(stderr,
						"Broadcast packet sent "
						"for %s\n",
						fdlist[i].nconf->nc_netid);
#endif
#ifdef PORTMAP
				/*
				 * Send the version 2 packet also
				 * for UDP/IP
				 */
				if (pmap_flag && fdlist[i].proto
				    == IPPROTO_UDP) {
					if (sendto
					    (fdlist[i].fd, outbuf_pmap,
					     outlen_pmap, 0, addr,
					     (size_t) fdlist[i].asize) !=
					    outlen_pmap) {
						__warnx
						   (TIRPC_DEBUG_FLAG_CLNT_BCAST,
						    "clnt_bcast: Cannot send "
						    "broadcast packet");
						stat = RPC_CANTSEND;
						continue;
					}
				}
#ifdef RPC_DEBUG
				fprintf(stderr,
					"PMAP Broadcast packet "
					"sent for %s\n",
					fdlist[i].nconf->nc_netid);
#endif
#endif				/* PORTMAP */
			}
			/* End for sending all packets on this transport */
		}		/* End for sending on all transports */

		if (eachresult == NULL) {
			stat = RPC_SUCCESS;
			goto done_broad;
		}

		/*
		 * Get all the replies from these broadcast requests
		 */
 recv_again:

		switch (pollretval = poll(pfd, fdlistno, msec)) {
		case 0:	/* timed out */
			stat = RPC_TIMEDOUT;
			continue;
		case -1:	/* some kind of error - we ignore it */
			goto recv_again;
		}		/* end of poll results switch */

		for (i = fds_found = 0; i < fdlistno && fds_found < pollretval;
		     i++) {
			bool done = false;

			if (pfd[i].revents == 0)
				continue;
			else if (pfd[i].revents & POLLNVAL) {
				/*
				 * Something bad has happened to this descri-
				 * ptor. We can cause _poll() to ignore
				 * it simply by using a negative fd.  We do that
				 * rather than compacting the pfd[] and fdlist[]
				 * arrays.
				 */
				pfd[i].fd = -1;
				fds_found++;
				continue;
			} else
				fds_found++;
#ifdef RPC_DEBUG
			fprintf(stderr, "response for %s\n",
				fdlist[i].nconf->nc_netid);
#endif
 try_again:
			inlen =
			    recvfrom(fdlist[i].fd, inbuf, fdlist[i].dsize, 0,
				     (struct sockaddr *)(void *)
				     &fdlist[i].raddr, &fdlist[i].asize);
			if (inlen < 0) {
				if (errno == EINTR)
					goto try_again;
				__warnx(TIRPC_DEBUG_FLAG_CLNT_BCAST,
					"clnt_bcast: Cannot receive reply to broadcast");
				stat = RPC_CANTRECV;
				continue;
			}
			if (inlen < sizeof(u_int32_t))
				continue;	/* Drop that and go ahead */
			/*
			 * see if reply transaction id matches sent id.
			 * If so, decode the results. If return id is xid + 1
			 * it was a PORTMAP reply
			 */
			if (*((u_int32_t *) (void *)(inbuf)) ==
			    *((u_int32_t *) (void *)(outbuf))) {
				pmap_reply_flag = 0;
				msg.RPCM_ack.ar_verf = _null_auth;
				msg.RPCM_ack.ar_results.where =
				    &bres;
				msg.RPCM_ack.ar_results.proc =
				    (xdrproc_t) xdr_rpcb_rmtcallres;
#ifdef PORTMAP
			} else if (pmap_flag
				   && *((u_int32_t *) (void *)(inbuf)) ==
				   *((u_int32_t *) (void *)(outbuf_pmap))) {
				pmap_reply_flag = 1;
				msg.RPCM_ack.ar_verf = _null_auth;
				msg.RPCM_ack.ar_results.where =
				    &bres_pmap;
				msg.RPCM_ack.ar_results.proc =
				    (xdrproc_t) xdr_rmtcallres;
#endif				/* PORTMAP */
			} else
				continue;
			xdrmem_create(xdrs, inbuf, (u_int) inlen, XDR_DECODE);
			if (xdr_replymsg(xdrs, &msg)) {
				if ((msg.rm_reply.rp_stat == MSG_ACCEPTED)
				    && (msg.RPCM_ack.ar_stat == SUCCESS)) {
					struct netbuf *np;
#ifdef PORTMAP
					struct netbuf taddr;
					struct sockaddr_in sin;

					if (pmap_flag && pmap_reply_flag) {
						memcpy(&sin, &fdlist[i].raddr,
						       sizeof(sin));
						sin.sin_port =
						    htons(bres_pmap.port);
						memcpy(&fdlist[i].raddr, &sin,
						       sizeof(sin));
						taddr.len = taddr.maxlen =
						    sizeof(fdlist[i].raddr);
						taddr.buf = &fdlist[i].raddr;
						done =
						    (*eachresult) (resultsp,
								   &taddr,
								   fdlist[i].
								   nconf);
					} else {
#endif				/* PORTMAP */
#ifdef RPC_DEBUG
						fprintf(stderr, "uaddr %s\n",
							uaddrp);
#endif
						np = uaddr2taddr(fdlist[i].
								 nconf, uaddrp);
						done =
						    (*eachresult) (resultsp, np,
								   fdlist[i].
								   nconf);
						mem_free(np, 0);
#ifdef PORTMAP
					}
#endif				/* PORTMAP */
				}
				/* otherwise, we just ignore the errors ... */
			}
			/* else some kind of deserialization problem ... */

			xdrs->x_op = XDR_FREE;
			msg.RPCM_ack.ar_results.proc = (xdrproc_t) xdr_void;
			(void)xdr_replymsg(xdrs, &msg);
			(void)(*xresults) (xdrs, resultsp);
			XDR_DESTROY(xdrs);
			if (done) {
				stat = RPC_SUCCESS;
				goto done_broad;
			} else {
				goto recv_again;
			}
		}		/* The recv for loop */
	}			/* The giant for loop */

 done_broad:
	if (inbuf)
		mem_free(inbuf, maxbufsize);
	if (outbuf)
		mem_free(outbuf, maxbufsize);
#ifdef PORTMAP
	if (outbuf_pmap)
		mem_free(outbuf_pmap, udpbufsz);
#endif				/* PORTMAP */
	for (i = 0; i < fdlistno; i++) {
		(void)close(fdlist[i].fd);
		__rpc_freebroadifs(&fdlist[i].nal);
	}
 cleanup:
	AUTH_DESTROY(sys_auth);
	(void)__rpc_endconf(handle);

	return (stat);
}